

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O0

void __thiscall
RasterizerA3<16u>::_renderImpl<CompositorScalar,true>(RasterizerA3<16u> *this,uint32_t argb32)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  unsigned_long uVar4;
  uint32_t bPix;
  uint32_t uVar5;
  uchar *puVar6;
  intptr_t iVar7;
  unsigned_long uVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  unsigned_long *puVar12;
  uint32_t *puVar13;
  unsigned_long uStack_240;
  uint32_t mask_2;
  unsigned_long local_238;
  uint32_t local_22c;
  unsigned_long uStack_228;
  uint32_t mask;
  size_t x1;
  BitWordFlipIterator<unsigned_long> it;
  size_t xOffset;
  size_t x0;
  int cover;
  uint32_t *dstPix;
  Cell *cell;
  size_t nBits;
  long lStack_1d8;
  CompositorScalar compositor;
  Cell *cellLine;
  BitWord *bitPtr;
  size_t y1;
  size_t y0;
  intptr_t dstStride;
  uint8_t *dstLine;
  uint32_t argb32_local;
  RasterizerA3<16U> *this_local;
  uint32_t index_1;
  unsigned_long bitWord_1;
  uint32_t index;
  unsigned_long bitWord;
  uint32_t local_124;
  uint32_t local_120;
  size_t local_100;
  size_t local_d8;
  uint32_t mask_1;
  size_t local_a0;
  uint32_t local_84;
  
  puVar6 = Image::data<unsigned_char>(*(Image **)(this + 8));
  iVar7 = Image::stride(*(Image **)(this + 8));
  y1 = (size_t)*(int *)(this + 0x40);
  iVar1 = *(int *)(this + 0x44);
  cellLine = (Cell *)(*(long *)(this + 0x50) + y1 * *(long *)(this + 0x48) * 8);
  lStack_1d8 = *(long *)(this + 0x60) + y1 * *(long *)(this + 0x58) * 8;
  bPix = PixelUtils::premultiply(argb32);
  dstStride = (intptr_t)(puVar6 + y1 * iVar7);
  do {
    if ((ulong)(long)iVar1 < y1) {
      Bounds::reset((Bounds *)(this + 0x40));
      return;
    }
    cell = *(Cell **)(this + 0x48);
    x0._4_4_ = 0;
    xOffset = 0;
    it._xorMask = 0;
    do {
      x1 = *(size_t *)cellLine;
      it._bitWord = 0;
      cellLine->cover = 0;
      cellLine->area = 0;
      while (uVar4 = it._xorMask, sVar3 = x1, x1 != 0) {
        if (x1 == 0) {
          __assert_fail("bitWord != T(0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/./intutils.h"
                        ,0x151,
                        "size_t IntUtils::BitWordFlipIterator<unsigned long>::nextAndFlip() [T = unsigned long]"
                       );
        }
        uVar5 = IntUtils::ctz<unsigned_long>(x1);
        uVar8 = IntUtils::allOnes<unsigned_long>();
        uVar9 = uVar8 << ((byte)uVar5 & 0x3f) ^ sVar3;
        uVar8 = IntUtils::allOnes<unsigned_long>();
        it._bitWord = uVar8 ^ it._bitWord;
        uVar10 = uVar4 + (ulong)uVar5 * 0x10;
        uStack_228 = uVar10;
        x1 = uVar9;
        if (xOffset < uVar10) {
          local_120 = x0._4_4_;
          if ((int)x0._4_4_ < 0) {
            local_120 = -x0._4_4_;
          }
          if (0xff < (int)local_120) {
            local_120 = 0xff;
          }
          local_22c = local_120;
          if (local_120 != 0) {
            local_d8 = xOffset;
            if (local_120 == 0xff) {
              for (; local_d8 < uVar10; local_d8 = local_d8 + 1) {
                *(uint32_t *)(dstStride + local_d8 * 4) = bPix;
              }
            }
            else {
              for (; local_d8 < uVar10; local_d8 = local_d8 + 1) {
                puVar13 = (uint32_t *)(dstStride + local_d8 * 4);
                uVar5 = PixelUtils::src(*puVar13,bPix,local_120);
                *puVar13 = uVar5;
              }
            }
          }
          xOffset = uStack_228;
        }
        uVar4 = it._xorMask;
        sVar3 = x1;
        if (x1 == 0) {
          local_238 = (unsigned_long)*(int *)(this + 0x30);
          uStack_240 = it._xorMask + 0x400;
          puVar12 = std::min<unsigned_long>(&local_238,&stack0xfffffffffffffdc0);
          uStack_228 = *puVar12;
        }
        else {
          if (x1 == 0) {
            __assert_fail("bitWord != T(0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/./intutils.h"
                          ,0x151,
                          "size_t IntUtils::BitWordFlipIterator<unsigned long>::nextAndFlip() [T = unsigned long]"
                         );
          }
          uVar5 = IntUtils::ctz<unsigned_long>(x1);
          uVar8 = IntUtils::allOnes<unsigned_long>();
          uVar11 = IntUtils::allOnes<unsigned_long>();
          it._bitWord = uVar11 ^ it._bitWord;
          uStack_228 = uVar4 + (ulong)uVar5 * 0x10;
          x1 = uVar8 << ((byte)uVar5 & 0x3f) ^ sVar3;
        }
        uVar9 = uStack_228;
        for (local_a0 = xOffset; local_a0 < uVar9; local_a0 = local_a0 + 1) {
          x0._4_4_ = *(int *)(lStack_1d8 + local_a0 * 8) + x0._4_4_;
          local_84 = x0._4_4_ - (*(int *)(lStack_1d8 + 4 + local_a0 * 8) >> 9);
          if ((int)local_84 < 0) {
            local_84 = -local_84;
          }
          if (0xff < (int)local_84) {
            local_84 = 0xff;
          }
          Cell::reset((Cell *)(lStack_1d8 + local_a0 * 8));
          if (local_84 == 0xff) {
            *(uint32_t *)(dstStride + local_a0 * 4) = bPix;
          }
          else {
            puVar13 = (uint32_t *)(dstStride + local_a0 * 4);
            uVar5 = PixelUtils::src(*puVar13,bPix,local_84);
            *puVar13 = uVar5;
          }
        }
        xOffset = uStack_228;
      }
      it._xorMask = it._xorMask + 0x400;
      cellLine = cellLine + 1;
      cell = (Cell *)((long)&cell[-1].area + 3);
    } while (cell != (Cell *)0x0);
    if (xOffset < (ulong)(long)*(int *)(this + 0x30)) {
      local_124 = x0._4_4_;
      if ((int)x0._4_4_ < 0) {
        local_124 = -x0._4_4_;
      }
      if (0xff < (int)local_124) {
        local_124 = 0xff;
      }
      if (local_124 != 0) {
        iVar2 = *(int *)(this + 0x30);
        local_100 = xOffset;
        if (local_124 == 0xff) {
          for (; local_100 < (ulong)(long)iVar2; local_100 = local_100 + 1) {
            *(uint32_t *)(dstStride + local_100 * 4) = bPix;
          }
        }
        else {
          for (; local_100 < (ulong)(long)iVar2; local_100 = local_100 + 1) {
            puVar13 = (uint32_t *)(dstStride + local_100 * 4);
            uVar5 = PixelUtils::src(*puVar13,bPix,local_124);
            *puVar13 = uVar5;
          }
        }
      }
    }
    dstStride = iVar7 + dstStride;
    lStack_1d8 = *(long *)(this + 0x58) * 8 + lStack_1d8;
    y1 = y1 + 1;
  } while( true );
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}